

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::check_huff_tables(jpeg_decoder *this)

{
  huff_tables *phVar1;
  int local_18;
  int local_14;
  int i_1;
  int i;
  jpeg_decoder *this_local;
  
  local_14 = 0;
  while( true ) {
    if (this->m_comps_in_scan <= local_14) {
      for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
        if (this->m_huff_num[local_18] != (uint8 *)0x0) {
          if (this->m_pHuff_tabs[local_18] == (huff_tables *)0x0) {
            phVar1 = (huff_tables *)alloc(this,0x1104,false);
            this->m_pHuff_tabs[local_18] = phVar1;
          }
          make_huff_table(this,local_18,this->m_pHuff_tabs[local_18]);
        }
      }
      return;
    }
    if ((this->m_spectral_start == 0) &&
       (this->m_huff_num[this->m_comp_dc_tab[this->m_comp_list[local_14]]] == (uint8 *)0x0)) break;
    if ((0 < this->m_spectral_end) &&
       (this->m_huff_num[this->m_comp_ac_tab[this->m_comp_list[local_14]]] == (uint8 *)0x0)) {
      stop_decoding(this,JPGD_UNDEFINED_HUFF_TABLE);
    }
    local_14 = local_14 + 1;
  }
  stop_decoding(this,JPGD_UNDEFINED_HUFF_TABLE);
}

Assistant:

void jpeg_decoder::check_huff_tables()
	{
		for (int i = 0; i < m_comps_in_scan; i++)
		{
			if ((m_spectral_start == 0) && (m_huff_num[m_comp_dc_tab[m_comp_list[i]]] == nullptr))
				stop_decoding(JPGD_UNDEFINED_HUFF_TABLE);

			if ((m_spectral_end > 0) && (m_huff_num[m_comp_ac_tab[m_comp_list[i]]] == nullptr))
				stop_decoding(JPGD_UNDEFINED_HUFF_TABLE);
		}

		for (int i = 0; i < JPGD_MAX_HUFF_TABLES; i++)
			if (m_huff_num[i])
			{
				if (!m_pHuff_tabs[i])
					m_pHuff_tabs[i] = (huff_tables*)alloc(sizeof(huff_tables));

				make_huff_table(i, m_pHuff_tabs[i]);
			}
	}